

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

uint __thiscall UnionType::indexOfType(UnionType *this,Type *type)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  raw_ostream *this_00;
  Type *in_RSI;
  long in_RDI;
  uint i;
  string *Str;
  raw_ostream *in_stack_ffffffffffffffa0;
  string local_38;
  uint local_14;
  Type *local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  while( true ) {
    uVar1 = (ulong)local_14;
    sVar2 = std::
            vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(in_RDI + 0x30));
    if (sVar2 <= uVar1) {
      llvm::errs();
      Str = &local_38;
      (*local_10->_vptr_Type[3])();
      this_00 = llvm::raw_ostream::operator<<(in_stack_ffffffffffffffa0,Str);
      llvm::raw_ostream::operator<<(this_00,(char *)Str);
      std::__cxx11::string::~string((string *)&local_38);
      abort();
    }
    pvVar3 = std::
             vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Type_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(in_RDI + 0x30),(ulong)local_14);
    if (pvVar3->first == local_10) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

unsigned UnionType::indexOfType(Type* type) const {
    for (unsigned i = 0; i < items.size(); ++i) {
        if (items[i].first == type) {
            return i;
        }
    }

    llvm::errs() << type->toString() << "\n";
    assert(false && "UnionType::indexOfType: type not found in the union");
    abort();
}